

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorTiledInstancer::GetTileProperties
          (DecoratorTiledInstancer *this,Tile *tiles,Texture *textures,size_t num_tiles_and_textures
          ,PropertyDictionary *properties,DecoratorInstancerInterface *instancer_interface)

{
  Spritesheet *pSVar1;
  code *pcVar2;
  bool bVar3;
  __type _Var4;
  TextureFileIndex TVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  Property *pPVar9;
  ulong uVar10;
  RenderManager *render_manager;
  undefined8 uVar11;
  float fVar12;
  Texture TVar13;
  Property *orientation_property;
  LengthPercentage local_188;
  LengthPercentage local_180;
  LengthPercentage local_178;
  LengthPercentage local_170;
  LengthPercentage local_168;
  Property *local_160;
  Property *property;
  LengthPercentage *align;
  Property *pPStack_148;
  int dimension;
  Property *align_properties [2];
  String local_130;
  Property *local_110;
  Property *fit_property;
  undefined8 uStack_100;
  Texture local_f8;
  Vector2Type local_e8;
  Vector2Type local_e0;
  Sprite *local_d8;
  Sprite *sprite;
  Texture *texture;
  Tile *tile;
  undefined1 local_b8 [8];
  String texture_name;
  Property *src_property;
  TilePropertyIds *ids;
  size_t i;
  Texture previous_texture;
  String previous_texture_name;
  DecoratorInstancerInterface *instancer_interface_local;
  PropertyDictionary *properties_local;
  size_t num_tiles_and_textures_local;
  Texture *textures_local;
  Tile *tiles_local;
  DecoratorTiledInstancer *this_local;
  
  sVar7 = ::std::
          vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
          ::size(&this->tile_property_ids);
  if ((num_tiles_and_textures != sVar7) &&
     (bVar3 = Assert("RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                     ,0x11f), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  ::std::__cxx11::string::string((string *)&previous_texture.file_index);
  Texture::Texture((Texture *)&i);
  for (ids = (TilePropertyIds *)0x0; ids < num_tiles_and_textures;
      ids = (TilePropertyIds *)&ids->fit) {
    pvVar8 = ::std::
             vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
             ::operator[](&this->tile_property_ids,(size_type)ids);
    pPVar9 = PropertyDictionary::GetProperty(properties,pvVar8->src);
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,pPVar9)
    ;
    uVar10 = ::std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"auto");
      if (bVar3) goto LAB_0053da6e;
      texture = (Texture *)(tiles + (long)ids);
      sprite = (Sprite *)(textures + (long)ids);
      local_d8 = DecoratorInstancerInterface::GetSprite(instancer_interface,(String *)local_b8);
      if (local_d8 == (Sprite *)0x0) {
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&previous_texture.file_index);
        if (_Var4) {
          (sprite->rectangle).p0.x = (float)(undefined4)i;
          (sprite->rectangle).p0.y = (float)i._4_4_;
          (sprite->rectangle).p1 = (Vector2Type)previous_texture.render_manager;
          goto LAB_0053dcf7;
        }
        TVar13 = DecoratorInstancerInterface::GetTexture(instancer_interface,(String *)local_b8);
        uStack_100 = TVar13._8_8_;
        fit_property = (Property *)TVar13.render_manager;
        (sprite->rectangle).p0 = (Vector2Type)TVar13.render_manager;
        (sprite->rectangle).p1.x = (float)TVar13.file_index;
        (sprite->rectangle).p1.y = (float)TVar13.callback_index;
        bVar3 = Texture::operator_cast_to_bool((Texture *)sprite);
        if (bVar3) {
          ::std::__cxx11::string::operator=
                    ((string *)&previous_texture.file_index,(string *)local_b8);
          i = *(size_t *)&(sprite->rectangle).p0;
          previous_texture.render_manager = *(RenderManager **)&(sprite->rectangle).p1;
          goto LAB_0053dcf7;
        }
        this_local._7_1_ = 0;
        tile._4_4_ = 1;
      }
      else {
        local_e0 = Rectangle<float>::Position(&local_d8->rectangle);
        texture->file_index = (TextureFileIndex)local_e0.x;
        texture->callback_index = (StableVectorIndex)local_e0.y;
        local_e8 = Rectangle<float>::Size(&local_d8->rectangle);
        texture[1].render_manager = (RenderManager *)local_e8;
        *(float *)((long)&texture->render_manager + 4) = local_d8->sprite_sheet->display_scale;
        pSVar1 = local_d8->sprite_sheet;
        render_manager = DecoratorInstancerInterface::GetRenderManager(instancer_interface);
        TVar13 = TextureSource::GetTexture(&pSVar1->texture_source,render_manager);
        (sprite->rectangle).p0 = (Vector2Type)TVar13.render_manager;
        (sprite->rectangle).p1.x = (float)TVar13.file_index;
        (sprite->rectangle).p1.y = (float)TVar13.callback_index;
        local_f8 = TVar13;
LAB_0053dcf7:
        if (pvVar8->fit != Invalid) {
          if ((pvVar8->align_x == Invalid) || (pvVar8->align_y == Invalid)) {
            bVar3 = Assert("RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid)"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                           ,0x159);
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
          }
          local_110 = PropertyDictionary::GetProperty(properties,pvVar8->fit);
          TVar5 = Variant::Get<int>(&local_110->value,0);
          texture[3].file_index = TVar5;
          if ((local_d8 != (Sprite *)0x0) &&
             (((texture[3].file_index == 5 || (texture[3].file_index == 6)) ||
              (texture[3].file_index == 7)))) {
            Property::ToString_abi_cxx11_(&local_130,local_110);
            uVar11 = ::std::__cxx11::string::c_str();
            Log::Message(LT_WARNING,
                         "Decorator \'fit\' value is \'%s\', which is incompatible with sprites",
                         uVar11);
            ::std::__cxx11::string::~string((string *)&local_130);
            this_local._7_1_ = 0;
            tile._4_4_ = 1;
            goto LAB_0053e155;
          }
          pPStack_148 = PropertyDictionary::GetProperty(properties,pvVar8->align_x);
          align_properties[0] = PropertyDictionary::GetProperty(properties,pvVar8->align_y);
          for (align._4_4_ = 0; align._4_4_ < 2; align._4_4_ = align._4_4_ + 1) {
            property = (Property *)(&texture[3].callback_index + (long)align._4_4_ * 2);
            local_160 = *(Property **)((long)&stack0xfffffffffffffeb8 + (long)align._4_4_ * 8);
            if (local_160->unit == KEYWORD) {
              iVar6 = Property::Get<int>(local_160);
              if (iVar6 == 0) {
                Style::LengthPercentage::LengthPercentage(&local_168,Percentage,0.0);
                (property->value).type = (Type)local_168;
              }
              else if (iVar6 == 1) {
                Style::LengthPercentage::LengthPercentage(&local_170,Percentage,50.0);
                (property->value).type = (Type)local_170;
              }
              else if (iVar6 == 2) {
                Style::LengthPercentage::LengthPercentage(&local_178,Percentage,100.0);
                (property->value).type = (Type)local_178;
              }
            }
            else if (local_160->unit == PERCENT) {
              fVar12 = Property::Get<float>(local_160);
              Style::LengthPercentage::LengthPercentage(&local_180,Percentage,fVar12);
              (property->value).type = (Type)local_180;
            }
            else if (local_160->unit == PX) {
              fVar12 = Property::Get<float>(local_160);
              Style::LengthPercentage::LengthPercentage(&local_188,Length,fVar12);
              (property->value).type = (Type)local_188;
            }
            else {
              Property::ToString_abi_cxx11_((String *)&orientation_property,local_160);
              uVar11 = ::std::__cxx11::string::c_str();
              Log::Message(LT_WARNING,
                           "Decorator alignment value is \'%s\' which uses an unsupported unit (use px, %%, or keyword)"
                           ,uVar11);
              ::std::__cxx11::string::~string((string *)&orientation_property);
            }
          }
        }
        if (pvVar8->orientation != Invalid) {
          pPVar9 = PropertyDictionary::GetProperty(properties,pvVar8->orientation);
          iVar6 = Variant::Get<int>(&pPVar9->value,0);
          *(int *)((long)&texture[3].render_manager + 4) = iVar6;
        }
        tile._4_4_ = 0;
      }
    }
    else {
LAB_0053da6e:
      tile._4_4_ = 4;
    }
LAB_0053e155:
    ::std::__cxx11::string::~string((string *)local_b8);
    if ((tile._4_4_ != 0) && (tile._4_4_ != 4)) goto LAB_0053e1af;
  }
  this_local._7_1_ = 1;
  tile._4_4_ = 1;
LAB_0053e1af:
  ::std::__cxx11::string::~string((string *)&previous_texture.file_index);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DecoratorTiledInstancer::GetTileProperties(DecoratorTiled::Tile* tiles, Texture* textures, size_t num_tiles_and_textures,
	const PropertyDictionary& properties, const DecoratorInstancerInterface& instancer_interface) const
{
	RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size());

	String previous_texture_name;
	Texture previous_texture;

	for (size_t i = 0; i < num_tiles_and_textures; i++)
	{
		const TilePropertyIds& ids = tile_property_ids[i];

		const Property* src_property = properties.GetProperty(ids.src);
		const String texture_name = src_property->Get<String>();

		// Skip the tile if it has no source name.
		// Declaring the name 'auto' is the same as an empty string. This gives an easy way to skip certain
		// tiles in a shorthand since we can't always declare an empty string.
		if (texture_name.empty() || texture_name == "auto")
			continue;

		// We are required to set default values before instancing the tile, thus, all properties should always be
		// dereferencable. If the debugger captures a zero-dereference, check that all properties for every tile is set
		// and default values are set just before instancing.

		DecoratorTiled::Tile& tile = tiles[i];
		Texture& texture = textures[i];

		const Sprite* sprite = instancer_interface.GetSprite(texture_name);

		// A tile is always either a sprite or an image.
		if (sprite)
		{
			tile.position = sprite->rectangle.Position();
			tile.size = sprite->rectangle.Size();
			tile.display_scale = sprite->sprite_sheet->display_scale;

			texture = sprite->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager());
		}
		else
		{
			// No sprite found, so assume that the name is an image source. Since the common use case is to specify the
			// same texture for all tiles, check the previous texture first before fetching from the global database.
			if (texture_name == previous_texture_name)
			{
				texture = previous_texture;
			}
			else
			{
				texture = instancer_interface.GetTexture(texture_name);

				if (!texture)
					return false;

				previous_texture_name = texture_name;
				previous_texture = texture;
			}
		}

		if (ids.fit != PropertyId::Invalid)
		{
			RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid);
			const Property& fit_property = *properties.GetProperty(ids.fit);
			tile.fit_mode = (DecoratorTiled::TileFitMode)fit_property.value.Get<int>();

			if (sprite &&
				(tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT || tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_X ||
					tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_Y))
			{
				Log::Message(Log::LT_WARNING, "Decorator 'fit' value is '%s', which is incompatible with sprites", fit_property.ToString().c_str());
				return false;
			}

			const Property* align_properties[2] = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};

			for (int dimension = 0; dimension < 2; dimension++)
			{
				using Style::LengthPercentage;

				LengthPercentage& align = tile.align[dimension];
				const Property& property = *align_properties[dimension];
				if (property.unit == Unit::KEYWORD)
				{
					enum { TOP_LEFT, CENTER, BOTTOM_RIGHT };
					switch (property.Get<int>())
					{
					case TOP_LEFT: align = LengthPercentage(LengthPercentage::Percentage, 0.0f); break;
					case CENTER: align = LengthPercentage(LengthPercentage::Percentage, 50.0f); break;
					case BOTTOM_RIGHT: align = LengthPercentage(LengthPercentage::Percentage, 100.0f); break;
					}
				}
				else if (property.unit == Unit::PERCENT)
				{
					align = LengthPercentage(LengthPercentage::Percentage, property.Get<float>());
				}
				else if (property.unit == Unit::PX)
				{
					align = LengthPercentage(LengthPercentage::Length, property.Get<float>());
				}
				else
				{
					Log::Message(Log::LT_WARNING, "Decorator alignment value is '%s' which uses an unsupported unit (use px, %%, or keyword)",
						property.ToString().c_str());
				}
			}
		}

		if (ids.orientation != PropertyId::Invalid)
		{
			const Property& orientation_property = *properties.GetProperty(ids.orientation);
			tile.orientation = (DecoratorTiled::TileOrientation)orientation_property.value.Get<int>();
		}
	}

	return true;
}